

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_Invert(InvertForm2 Invert,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  reference pvVar2;
  code *in_RDI;
  pair<double,_double> pVar3;
  uint32_t i;
  TimerContainer timer;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer *in_stack_ffffffffffffff60;
  reference in_stack_ffffffffffffff70;
  uint local_74;
  pointer in_stack_ffffffffffffffc0;
  undefined4 local_10;
  uint32_t in_stack_fffffffffffffff4;
  undefined4 uVar4;
  uint32_t in_stack_fffffffffffffff8;
  undefined4 uVar5;
  uint32_t in_stack_fffffffffffffffc;
  undefined4 uVar6;
  
  Test_Helper::uniformImages
            (in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  SetupFunction((string *)0x173bd3);
  Performance_Test::TimerContainer::TimerContainer(in_stack_ffffffffffffff60);
  local_74 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= local_74) break;
    Performance_Test::TimerContainer::start(in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff70 =
         std::
         vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       *)&stack0xffffffffffffffc0,0);
    pvVar2 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&stack0xffffffffffffffc0,1);
    (*in_RDI)(in_stack_ffffffffffffff70,pvVar2);
    Performance_Test::TimerContainer::stop((TimerContainer *)in_stack_ffffffffffffff70);
    local_74 = local_74 + 1;
  }
  CleanupFunction((string *)0x173cb5);
  pVar3 = Performance_Test::BaseTimerContainer::mean
                    ((BaseTimerContainer *)in_stack_ffffffffffffffc0);
  local_10 = pVar3.first._0_4_;
  uVar4 = pVar3.first._4_4_;
  uVar5 = pVar3.second._0_4_;
  uVar6 = pVar3.second._4_4_;
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x173cf5);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffff70);
  pVar3.first._4_4_ = uVar4;
  pVar3.first._0_4_ = local_10;
  pVar3.second._0_4_ = uVar5;
  pVar3.second._4_4_ = uVar6;
  return pVar3;
}

Assistant:

std::pair < double, double > template_Invert( InvertForm2 Invert, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );

        TEST_FUNCTION_LOOP( Invert( image[0], image[1] ), namespaceName )
    }